

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_utils.hpp
# Opt level: O0

void duckdb::ParquetDecodeUtils::SkipAligned(ByteBuffer *src,idx_t count,bitpacking_width_t width)

{
  undefined8 uVar1;
  ulong in_RSI;
  idx_t read_size;
  uint64_t in_stack_ffffffffffffff98;
  ByteBuffer *in_stack_ffffffffffffffa0;
  allocator *paVar2;
  allocator local_39;
  string local_38 [8];
  unsigned_long in_stack_ffffffffffffffd0;
  string *in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe0;
  uint8_t in_stack_ffffffffffffffe7;
  
  CheckWidth(in_stack_ffffffffffffffe7);
  if ((in_RSI & 0x1f) != 0) {
    uVar1 = __cxa_allocate_exception(0x10);
    paVar2 = &local_39;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_38,"Aligned bitpacking count must be a multiple of %llu",paVar2);
    InvalidInputException::InvalidInputException<unsigned_long>
              ((InvalidInputException *)
               CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),
               in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    __cxa_throw(uVar1,&InvalidInputException::typeinfo,InvalidInputException::~InvalidInputException
               );
  }
  ByteBuffer::inc(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  return;
}

Assistant:

static void SkipAligned(ByteBuffer &src, const idx_t count, const bitpacking_width_t width) {
		CheckWidth(width);
		if (count % BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE != 0) {
			throw InvalidInputException("Aligned bitpacking count must be a multiple of %llu",
			                            BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE);
		}
		const auto read_size = count * width / BITPACK_DLEN;
		src.inc(read_size);
	}